

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer puVar4;
  pointer puVar5;
  pointer pdVar6;
  pointer pEVar7;
  pointer pvVar8;
  pointer pdVar9;
  pointer pdVar10;
  iterator __position;
  pointer pEVar11;
  void *pvVar12;
  EditType *pEVar13;
  long lVar14;
  long lVar15;
  pointer pEVar16;
  EditType EVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 local_a0 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  undefined1 local_68 [8];
  EditType move;
  pointer local_58;
  undefined1 local_50 [8];
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  
  puVar4 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_50,
             ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)local_68);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_a0,((long)puVar5 - (long)puVar4 >> 3) + 1,(value_type *)local_50,
           (allocator_type *)
           ((long)&best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (local_50 != (undefined1  [8])0x0) {
    operator_delete((void *)local_50,
                    (long)best_move.
                          super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_50);
  }
  puVar4 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            *)local_68,
           ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start >> 3) + 1,
           (allocator_type *)
           ((long)&best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
            *)local_50,((long)puVar5 - (long)puVar4 >> 3) + 1,(value_type *)local_68,
           (allocator_type *)
           ((long)&best_move.
                   super__Vector_base<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  pvVar12 = (void *)CONCAT44(local_68._4_4_,local_68._0_4_);
  if (pvVar12 != (void *)0x0) {
    operator_delete(pvVar12,(long)local_58 - (long)pvVar12);
  }
  if ((long)costs.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start - (long)local_a0 != 0) {
    lVar14 = ((long)costs.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)local_a0 >> 3) *
             -0x5555555555555555;
    lVar19 = 0;
    lVar20 = 0;
    do {
      auVar22._8_4_ = (int)((ulong)lVar20 >> 0x20);
      auVar22._0_8_ = lVar20;
      auVar22._12_4_ = 0x45300000;
      **(double **)
        ((long)&(((_Vector_base<double,_std::allocator<double>_> *)local_a0)->_M_impl).
                super__Vector_impl_data._M_start + lVar19) =
           (auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
      **(undefined4 **)
        ((long)&(((_Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                   *)local_50)->_M_impl).super__Vector_impl_data._M_start + lVar19) = 2;
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x18;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar20);
  }
  pdVar6 = (((_Vector_base<double,_std::allocator<double>_> *)local_a0)->_M_impl).
           super__Vector_impl_data._M_start;
  uVar18 = (long)(((_Vector_base<double,_std::allocator<double>_> *)local_a0)->_M_impl).
                 super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
  if (1 < uVar18) {
    pEVar7 = (((_Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                *)local_50)->_M_impl).super__Vector_impl_data._M_start;
    uVar21 = 1;
    do {
      auVar23._8_4_ = (int)(uVar21 >> 0x20);
      auVar23._0_8_ = uVar21;
      auVar23._12_4_ = 0x45300000;
      pdVar6[uVar21] =
           (auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar21) - 4503599627370496.0);
      pEVar7[uVar21] = kAdd;
      uVar21 = uVar21 + 1;
    } while (uVar18 != uVar21);
  }
  pvVar8 = (pointer)(left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  costs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish;
  lVar14 = (long)costs.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar8 >> 3;
  if (costs.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != pvVar8) {
    puVar4 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar19 = (long)puVar5 - (long)puVar4 >> 3;
    lVar20 = 0;
    do {
      if (puVar5 != puVar4) {
        pdVar6 = (&(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start)[lVar20];
        lVar15 = 0;
        do {
          if (pdVar6 == (pointer)puVar4[lVar15]) {
            (((pointer)((long)local_a0 + (lVar20 + 1) * 0x18))->
            super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
            _M_start[lVar15 + 1] =
                 (((pointer)((long)local_a0 + lVar20 * 0x18))->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
            EVar17 = kMatch;
          }
          else {
            pdVar9 = (((pointer)((long)local_a0 + (lVar20 + 1) * 0x18))->
                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar1 = pdVar9[lVar15];
            pdVar10 = (((pointer)((long)local_a0 + lVar20 * 0x18))->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar2 = pdVar10[lVar15];
            dVar3 = pdVar10[lVar15 + 1];
            if ((dVar3 <= dVar1) || (dVar2 <= dVar1)) {
              if ((dVar1 <= dVar3) || (dVar2 <= dVar3)) {
                pdVar9[lVar15 + 1] = dVar2 + 1.00001;
                EVar17 = kReplace;
              }
              else {
                pdVar9[lVar15 + 1] = dVar3 + 1.0;
                EVar17 = kRemove;
              }
            }
            else {
              pdVar9[lVar15 + 1] = dVar1 + 1.0;
              EVar17 = kAdd;
            }
          }
          (((pointer)((long)local_50 + (lVar20 + 1) * 0x18))->
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          )._M_impl.super__Vector_impl_data._M_start[lVar15 + 1] = EVar17;
          lVar15 = lVar15 + 1;
        } while (lVar19 + (ulong)(lVar19 == 0) != lVar15);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar14 + (ulong)(lVar14 == 0));
  }
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar5 != puVar4 ||
      costs.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != pvVar8) {
    lVar19 = (long)puVar5 - (long)puVar4 >> 3;
    do {
      local_68._0_4_ =
           (((pointer)((long)local_50 + lVar14 * 0x18))->
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar19];
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
        ::_M_realloc_insert<testing::internal::edit_distance::EditType_const&>
                  ((vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
                    *)__return_storage_ptr__,__position,(EditType *)local_68);
      }
      else {
        *__position._M_current = local_68._0_4_;
        (__return_storage_ptr__->
        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar14 = lVar14 - (ulong)(local_68._0_4_ != kAdd);
      lVar19 = lVar19 - (ulong)(local_68._0_4_ != kRemove);
    } while (lVar14 != 0 || lVar19 != 0);
  }
  pEVar7 = (__return_storage_ptr__->
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar11 = (__return_storage_ptr__->
            super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pEVar16 = pEVar11 + -1;
  if (pEVar7 < pEVar16 && pEVar7 != pEVar11) {
    do {
      pEVar13 = pEVar7 + 1;
      EVar17 = *pEVar7;
      *pEVar7 = *pEVar16;
      *pEVar16 = EVar17;
      pEVar16 = pEVar16 + -1;
      pEVar7 = pEVar13;
    } while (pEVar13 < pEVar16);
  }
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             *)local_50);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}